

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::PatternMap::getPatternFromBasePattern
          (PatternMap *this,UnicodeString *basePattern,UBool *skeletonWasSpecified)

{
  int8_t iVar1;
  char16_t baseChar;
  PtnElem *pPVar2;
  
  baseChar = icu_63::UnicodeString::doCharAt(basePattern,0);
  pPVar2 = getHeader(this,baseChar);
  while( true ) {
    if (pPVar2 == (PtnElem *)0x0) {
      return (UnicodeString *)0x0;
    }
    iVar1 = icu_63::UnicodeString::compare(basePattern,&pPVar2->basePattern);
    if (iVar1 == '\0') break;
    pPVar2 = (pPVar2->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
  }
  *skeletonWasSpecified = pPVar2->skeletonWasSpecified;
  return &pPVar2->pattern;
}

Assistant:

const UnicodeString *
PatternMap::getPatternFromBasePattern(const UnicodeString& basePattern, UBool& skeletonWasSpecified) const { // key to search for
   PtnElem *curElem;

   if ((curElem=getHeader(basePattern.charAt(0)))==nullptr) {
       return nullptr;  // no match
   }

   do  {
       if ( basePattern.compare(curElem->basePattern)==0 ) {
          skeletonWasSpecified = curElem->skeletonWasSpecified;
          return &(curElem->pattern);
       }
       curElem = curElem->next.getAlias();
   } while (curElem != nullptr);

   return nullptr;
}